

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O3

VerySimpleReadOnlyString __thiscall
Strings::VerySimpleReadOnlyString::upToFirst
          (VerySimpleReadOnlyString *this,VerySimpleReadOnlyString *find,bool includeFind)

{
  uint uVar1;
  uint uVar2;
  char *__s;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  char in_CL;
  undefined7 in_register_00000011;
  ulong uVar6;
  ulong extraout_RDX;
  int iVar7;
  char *pcVar8;
  uint uVar9;
  uint uVar10;
  VerySimpleReadOnlyString VVar11;
  
  uVar1 = find->length;
  __s = find->data;
  uVar2 = *(uint *)((long *)CONCAT71(in_register_00000011,includeFind) + 1);
  uVar6 = (ulong)uVar2;
  iVar7 = 0;
  uVar3 = 0;
  do {
    uVar9 = uVar3;
    if (uVar3 < uVar1) {
      uVar9 = uVar1;
    }
    uVar10 = 0;
LAB_0010e64f:
    uVar4 = uVar1;
    if (uVar9 + iVar7 == uVar10) goto LAB_0010e678;
    if (*(char *)(*(long *)CONCAT71(in_register_00000011,includeFind) + (ulong)uVar10) ==
        __s[uVar3 + uVar10]) break;
    uVar3 = uVar3 + 1;
    iVar7 = iVar7 + -1;
  } while( true );
  uVar10 = uVar10 + 1;
  uVar4 = uVar3;
  if (uVar2 != uVar10) goto LAB_0010e64f;
LAB_0010e678:
  pcVar8 = "";
  if (in_CL == '\0') {
    pcVar8 = __s;
  }
  if (uVar4 != uVar1) {
    pcVar8 = __s;
  }
  if (in_CL == '\0') {
LAB_0010e69c:
    this->data = __s;
    if (uVar4 != 0xffffffff) goto LAB_0010e6b2;
    if (__s != (char *)0x0) {
      sVar5 = strlen(__s);
      uVar4 = (uint)sVar5;
      uVar6 = extraout_RDX;
      goto LAB_0010e6b2;
    }
  }
  else {
    if (uVar4 != uVar1) {
      uVar4 = uVar4 + uVar2;
      goto LAB_0010e69c;
    }
    this->data = pcVar8;
  }
  uVar4 = 0;
LAB_0010e6b2:
  this->length = uVar4;
  VVar11._8_8_ = uVar6;
  VVar11.data = (tCharPtr)this;
  return VVar11;
}

Assistant:

const VerySimpleReadOnlyString VerySimpleReadOnlyString::upToFirst(const VerySimpleReadOnlyString & find, const bool includeFind) const
	{
	    const unsigned int pos = Find(find);
	    return VerySimpleReadOnlyString(pos == (unsigned int)length && includeFind ? "" : data, includeFind ? (pos == (unsigned int)length ? 0 : pos + (unsigned int)find.length) : pos);
	}